

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

long * __thiscall
kj::_::NullableValue<long>::emplace<long_long>(NullableValue<long> *this,longlong *params)

{
  longlong *params_00;
  longlong *params_local;
  NullableValue<long> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<long>(&(this->field_1).value);
  }
  params_00 = fwd<long_long>(params);
  ctor<long,long_long>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (long *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }